

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_reopen_named_kvs(void)

{
  fdb_status fVar1;
  size_t metalen;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffff7e8;
  fdb_file_handle *in_stack_fffffffffffff7f0;
  fdb_doc **in_stack_fffffffffffff7f8;
  size_t in_stack_fffffffffffff810;
  fdb_kvs_info *in_stack_fffffffffffff950;
  fdb_kvs_handle *in_stack_fffffffffffff958;
  fdb_kvs_config *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff998;
  fdb_kvs_handle **in_stack_fffffffffffff9a0;
  fdb_file_handle *in_stack_fffffffffffff9a8;
  fdb_config *in_stack_fffffffffffffa08;
  char *in_stack_fffffffffffffa10;
  fdb_file_handle **in_stack_fffffffffffffa18;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_info kvs_info;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int nkvdocs;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  fdb_kvs_open(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x248);
    compact_reopen_named_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x248,"void compact_reopen_named_kvs()");
    }
  }
  for (n = 0; n < 100; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x1072d2;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                   (size_t)in_stack_fffffffffffff7e8,meta,metalen,(void *)0x107309,
                   in_stack_fffffffffffff810);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff7e8 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7e8,'\0');
  fdb_compact(in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8);
  fdb_get_kvs_info(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  fdb_kvs_close(in_stack_fffffffffffff7e8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff7e8);
  fdb_open(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  fdb_kvs_open(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990);
  fdb_get_kvs_info(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  if ((long)(int)kvs_info.last_seqnum != kvs_info.last_seqnum) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x267);
    compact_reopen_named_kvs::__test_pass = 0;
    if ((long)(int)kvs_info.last_seqnum != kvs_info.last_seqnum) {
      __assert_fail("(uint64_t)nkvdocs == kvs_info.doc_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x267,"void compact_reopen_named_kvs()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffff7e8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff7e8);
  for (n = 0; n < 100; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x107453);
  }
  fdb_shutdown();
  memleak_end();
  if (compact_reopen_named_kvs::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","compact reopen named kvs");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","compact reopen named kvs");
  }
  return;
}

Assistant:

void compact_reopen_named_kvs()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int nkvdocs;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_kvs_info kvs_info;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_named_kvs");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // compact
    fdb_compact(dbfile, NULL);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen named kvs");
}